

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O1

string * compute_crc(string *__return_storage_ptr__,string *msg)

{
  pointer pcVar1;
  ulong uVar2;
  long lVar3;
  string m;
  string crc;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (msg->_M_dataplus)._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + msg->_M_string_length);
  std::__cxx11::string::append((char *)&local_58);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"10000000000000101","");
  if (local_50 != 0x10) {
    uVar2 = 0;
    do {
      if (*(char *)((long)local_58 + uVar2) != '0') {
        lVar3 = 0;
        do {
          *(byte *)((long)local_58 + lVar3 + uVar2) =
               *(char *)((long)local_58 + lVar3 + uVar2) == *(char *)((long)local_38[0] + lVar3) ^
               0x31;
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 0x11);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_50 - 0x10U);
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_58);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string compute_crc(string msg) {
//	string m = msg + "000";
//	string crc = "1011";
	string m = msg + "0000000000000000";
	string crc = "10000000000000101";
	int len = m.length();

	for (int i = 0; i < m.length() - 16; ++i) {
		if(m[i] == '0') continue;
		/* cout << m << endl; */
		string_xor(m.begin() + i, crc.begin(), 17);
	}
	/* cout << "final\n"; */
//	cout <<  m << endl;
	return m.substr(len - 16, 16);
}